

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::WriteMotorCurrentLimit(AmpIO *this,uint index,uint16_t mcurlim)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if ((7 < uVar3) && (-1 < (short)mcurlim)) {
    bVar2 = HasQLA(this);
    if ((bVar2) &&
       ((pBVar1 = (this->super_FpgaIO).super_BoardIO.port, pBVar1 != (BasePort *)0x0 &&
        (index < this->NumMotors)))) {
      iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)(index * 0x10 + 0x1b),(ulong)(mcurlim | 0x1000000));
      return SUB41(iVar4,0);
    }
  }
  return false;
}

Assistant:

bool AmpIO::WriteMotorCurrentLimit(unsigned int index, uint16_t mcurlim)
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;
    // Return false if motor current limit exceeds maximum range (rather
    // than allowing firmware to set msb to 0).
    if (mcurlim > 0x7fff) return ret;

    if (HasQLA() && port && (index < NumMotors)) {
        uint32_t cfg = MCFG_SET_CUR_LIMIT | mcurlim;
        unsigned int channel = (index+1) << 4;
        ret = port->WriteQuadlet(BoardId, channel | MOTOR_CONFIG_REG, cfg);
    }
    return ret;
}